

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesFrequencyGetProperties(zes_freq_handle_t hFrequency,zes_freq_properties_t *pProperties)

{
  zes_pfnFrequencyGetProperties_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnFrequencyGetProperties_t pfnGetProperties;
  zes_freq_properties_t *pProperties_local;
  zes_freq_handle_t hFrequency_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Frequency).pfnGetProperties;
    if (p_Var1 == (zes_pfnFrequencyGetProperties_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hFrequency_local._4_4_ = (*p_Var1)(hFrequency,pProperties);
    }
  }
  else {
    hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hFrequency_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesFrequencyGetProperties(
    zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
    zes_freq_properties_t* pProperties              ///< [in,out] The frequency properties for the specified domain.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFrequencyGetProperties_t pfnGetProperties = [&result] {
        auto pfnGetProperties = ze_lib::context->zesDdiTable.load()->Frequency.pfnGetProperties;
        if( nullptr == pfnGetProperties ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetProperties;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetProperties( hFrequency, pProperties );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetProperties = ze_lib::context->zesDdiTable.load()->Frequency.pfnGetProperties;
    if( nullptr == pfnGetProperties ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetProperties( hFrequency, pProperties );
    #endif
}